

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O0

void melee_effect_handler_EAT_GOLD(melee_effect_handler_context_t *context)

{
  int iVar1;
  player *ppVar2;
  _Bool _Var3;
  uint8_t uVar4;
  uint32_t uVar5;
  object *obj_00;
  object_kind *k;
  wchar_t local_3c;
  object *obj;
  wchar_t amt;
  int32_t gold;
  player *current_player;
  melee_effect_handler_context_t *context_local;
  
  ppVar2 = context->p;
  _Var3 = monster_damage_target(context,true);
  if (!_Var3) {
    context->obvious = true;
    if ((ppVar2->timed[3] == 0) &&
       (uVar5 = Rand_div(100),
       (int)uVar5 < adj_dex_safe[(ppVar2->state).stat_ind[3]] + (int)ppVar2->lev)) {
      msg("You quickly protect your money pouch!");
      uVar5 = Rand_div(3);
      if (uVar5 != 0) {
        context->blinked = true;
      }
    }
    else {
      iVar1 = ppVar2->au;
      uVar5 = Rand_div(0x19);
      obj._4_4_ = iVar1 / 10 + uVar5 + 1;
      if (obj._4_4_ < L'\x02') {
        obj._4_4_ = L'\x02';
      }
      if (L'ᎈ' < obj._4_4_) {
        iVar1 = ppVar2->au;
        uVar5 = Rand_div(3000);
        obj._4_4_ = iVar1 / 0x14 + uVar5 + 1;
      }
      if (ppVar2->au < obj._4_4_) {
        obj._4_4_ = ppVar2->au;
      }
      ppVar2->au = ppVar2->au - obj._4_4_;
      if (obj._4_4_ < L'\x01') {
        msg("Nothing was stolen.");
      }
      else {
        msg("Your purse feels lighter.");
        if (ppVar2->au == 0) {
          msg("All of your coins were stolen!");
        }
        else {
          msg("%d coins were stolen!",(ulong)(uint)obj._4_4_);
        }
        while (L'\0' < obj._4_4_) {
          obj_00 = object_new();
          k = money_kind("gold",obj._4_4_);
          object_prep(obj_00,k,L'\0',MINIMISE);
          if (obj._4_4_ < L'耀') {
            local_3c = obj._4_4_;
          }
          else {
            local_3c = L'翿';
          }
          obj_00->pval = (int16_t)local_3c;
          obj._4_4_ = obj._4_4_ - local_3c;
          obj_00->origin = '\x11';
          uVar4 = convert_depth_to_origin((int)ppVar2->depth);
          obj_00->origin_depth = uVar4;
          obj_00->origin_place = ppVar2->place;
          monster_carry((chunk *)cave,context->mon,obj_00);
        }
        ppVar2->upkeep->redraw = ppVar2->upkeep->redraw | 0x100;
        context->blinked = true;
      }
    }
  }
  return;
}

Assistant:

static void melee_effect_handler_EAT_GOLD(melee_effect_handler_context_t *context)
{
	struct player *current_player = context->p;

	/* Take damage */
	if (monster_damage_target(context, true)) return;

    /* Obvious */
    context->obvious = true;

    /* Attempt saving throw (unless paralyzed) based on dex and level */
    if (!current_player->timed[TMD_PARALYZED] &&
        (randint0(100) < (adj_dex_safe[current_player->state.stat_ind[STAT_DEX]]
						  + current_player->lev))) {
        /* Saving throw message */
        msg("You quickly protect your money pouch!");

        /* Occasional blink anyway */
        if (randint0(3)) context->blinked = true;
    } else {
        int32_t gold = (current_player->au / 10) + randint1(25);
        if (gold < 2) gold = 2;
        if (gold > 5000) gold = (current_player->au / 20) + randint1(3000);
        if (gold > current_player->au) gold = current_player->au;
        current_player->au -= gold;
        if (gold <= 0) {
            msg("Nothing was stolen.");
            return;
        }

        /* Let the player know they were robbed */
        msg("Your purse feels lighter.");
        if (current_player->au)
            msg("%d coins were stolen!", gold);
        else
            msg("All of your coins were stolen!");

        /* While we have gold, put it in objects */
        while (gold > 0) {
            int amt;

            /* Create a new temporary object */
            struct object *obj = object_new();
            object_prep(obj, money_kind("gold", gold), 0, MINIMISE);

            /* Amount of gold to put in this object */
            amt = gold > MAX_PVAL ? MAX_PVAL : gold;
            obj->pval = amt;
            gold -= amt;

            /* Set origin to stolen, so it is not confused with
             * dropped treasure in monster_death */
            obj->origin = ORIGIN_STOLEN;
			obj->origin_depth = convert_depth_to_origin(current_player->depth);
			obj->origin_place = current_player->place;

            /* Give the gold to the monster */
            monster_carry(cave, context->mon, obj);
        }

        /* Redraw gold */
        current_player->upkeep->redraw |= (PR_GOLD);

        /* Blink away */
        context->blinked = true;
    }
}